

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool checkCanImportFromRootPaths(Options *options,QString *absolutePath,QString *moduleUrlPath)

{
  pointer pQVar1;
  byte bVar2;
  pointer pQVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  QStringBuilder<QString_&,_const_QString_&> local_78;
  QString local_68;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (options->rootPaths).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_start;
  pQVar1 = (options->rootPaths).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pQVar3 == pQVar1) {
    bVar2 = 0;
  }
  else {
    do {
      local_50.d.d = (pQVar3->d).d;
      local_50.d.ptr = (pQVar3->d).ptr;
      local_50.d.size = (pQVar3->d).size;
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_50.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_50.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_78.a = &local_50;
      local_78.b = moduleUrlPath;
      QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>(&local_68,&local_78);
      if (local_68.d.size == (absolutePath->d).size) {
        QVar4.m_data = local_68.d.ptr;
        QVar4.m_size = local_68.d.size;
        QVar5.m_data = (absolutePath->d).ptr;
        QVar5.m_size = local_68.d.size;
        bVar2 = QtPrivate::equalStrings(QVar4,QVar5);
      }
      else {
        bVar2 = 0;
      }
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar3 = pQVar3 + 1;
    } while ((pQVar3 == pQVar1 | bVar2) != 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)bVar2;
}

Assistant:

bool checkCanImportFromRootPaths(const Options *options, const QString &absolutePath,
                                 const QString &moduleUrlPath)
{
    for (auto rootPath : options->rootPaths) {
        if ((rootPath + moduleUrlPath) == absolutePath)
            return true;
    }
    return false;
}